

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# descriptor_opt.cpp
# Opt level: O2

void get_msurf_descriptor_precompute_gauss_array(integral_image *iimage,interest_point *ipoint)

{
  float fVar1;
  float fVar2;
  float fVar3;
  float fVar4;
  float fVar5;
  int i;
  uint uVar6;
  int iVar7;
  uint uVar8;
  long lVar9;
  ulong uVar10;
  int scale;
  float *pfVar11;
  int k;
  int iVar12;
  int iVar13;
  bool bVar14;
  undefined1 auVar15 [16];
  undefined1 auVar16 [16];
  undefined1 auVar17 [16];
  undefined1 auVar18 [16];
  undefined1 auVar19 [16];
  undefined1 auVar20 [16];
  undefined1 auVar21 [16];
  undefined1 auVar22 [16];
  undefined1 auVar23 [16];
  undefined1 auVar24 [16];
  undefined1 auVar25 [16];
  undefined1 auVar26 [16];
  float fVar27;
  undefined1 auVar28 [16];
  undefined1 auVar29 [16];
  undefined1 auVar30 [64];
  undefined1 auVar31 [16];
  undefined1 auVar32 [16];
  undefined1 auVar33 [64];
  float fVar34;
  float fVar35;
  float fVar36;
  float local_f8;
  float fStack_f4;
  float fStack_f0;
  float fStack_ec;
  uint local_e0;
  long local_d0;
  ulong local_c8;
  float ry;
  float rx;
  ulong local_b8;
  long local_b0;
  long local_a8;
  float *local_a0;
  long local_98;
  float *local_90;
  ulong local_88;
  ulong local_80;
  float local_78;
  float local_74;
  interest_point *local_70;
  undefined1 local_68 [16];
  ulong local_58;
  integral_image *local_50;
  undefined1 local_48 [16];
  
  auVar31._8_4_ = 0x3effffff;
  auVar31._0_8_ = 0x3effffff3effffff;
  auVar31._12_4_ = 0x3effffff;
  auVar26._8_4_ = 0x80000000;
  auVar26._0_8_ = 0x8000000080000000;
  auVar26._12_4_ = 0x80000000;
  fVar27 = ipoint->scale;
  local_48 = ZEXT416((uint)fVar27);
  auVar15 = vpternlogd_avx512vl(auVar31,local_48,auVar26,0xf8);
  auVar15 = ZEXT416((uint)(fVar27 + auVar15._0_4_));
  auVar15 = vroundss_avx(auVar15,auVar15,0xb);
  scale = (int)auVar15._0_4_;
  fVar36 = -0.08 / (fVar27 * fVar27);
  auVar15 = vpternlogd_avx512vl(auVar31,ZEXT416((uint)ipoint->x),auVar26,0xf8);
  auVar18._0_8_ = (double)fVar27;
  auVar18._8_8_ = 0;
  auVar15 = ZEXT416((uint)(ipoint->x + auVar15._0_4_));
  auVar15 = vroundss_avx(auVar15,auVar15,0xb);
  auVar16._0_8_ = (double)auVar15._0_4_;
  auVar16._8_8_ = auVar15._8_8_;
  auVar15 = vfmadd231sd_fma(auVar16,auVar18,ZEXT816(0x3fe0000000000000));
  local_74 = (float)auVar15._0_8_;
  auVar15 = vpternlogd_avx512vl(auVar31,ZEXT416((uint)ipoint->y),auVar26,0xf8);
  auVar15 = ZEXT416((uint)(ipoint->y + auVar15._0_4_));
  auVar15 = vroundss_avx(auVar15,auVar15,0xb);
  auVar17._0_8_ = (double)auVar15._0_4_;
  auVar17._8_8_ = auVar15._8_8_;
  auVar15 = vfmadd231sd_fma(auVar17,auVar18,ZEXT816(0x3fe0000000000000));
  local_78 = (float)auVar15._0_8_;
  auVar15 = vpternlogd_avx512vl(auVar31,ZEXT416((uint)(fVar27 * 0.5)),auVar26,0xf8);
  auVar15 = ZEXT416((uint)(fVar27 * 0.5 + auVar15._0_4_));
  auVar15 = vroundss_avx(auVar15,auVar15,0xb);
  auVar16 = vpternlogd_avx512vl(auVar31,ZEXT416((uint)(fVar27 * 1.5)),auVar26,0xf8);
  auVar16 = ZEXT416((uint)(fVar27 * 1.5 + auVar16._0_4_));
  auVar16 = vroundss_avx(auVar16,auVar16,0xb);
  auVar17 = vpternlogd_avx512vl(auVar31,ZEXT416((uint)(fVar27 * 2.5)),auVar26,0xf8);
  auVar17 = ZEXT416((uint)(fVar27 * 2.5 + auVar17._0_4_));
  auVar17 = vroundss_avx(auVar17,auVar17,0xb);
  auVar18 = vpternlogd_avx512vl(auVar31,ZEXT416((uint)(fVar27 * 3.5)),auVar26,0xf8);
  auVar18 = ZEXT416((uint)(fVar27 * 3.5 + auVar18._0_4_));
  auVar18 = vroundss_avx(auVar18,auVar18,0xb);
  auVar19 = vpternlogd_avx512vl(auVar31,ZEXT416((uint)(fVar27 * 4.5)),auVar26,0xf8);
  auVar19 = ZEXT416((uint)(fVar27 * 4.5 + auVar19._0_4_));
  auVar19 = vroundss_avx(auVar19,auVar19,0xb);
  auVar20 = vpternlogd_avx512vl(auVar31,ZEXT416((uint)(fVar27 * 5.5)),auVar26,0xf8);
  auVar20 = ZEXT416((uint)(auVar20._0_4_ + fVar27 * 5.5));
  auVar20 = vroundss_avx(auVar20,auVar20,0xb);
  auVar21 = vpternlogd_avx512vl(auVar31,ZEXT416((uint)(fVar27 * 6.5)),auVar26,0xf8);
  auVar21 = ZEXT416((uint)(fVar27 * 6.5 + auVar21._0_4_));
  auVar21 = vroundss_avx(auVar21,auVar21,0xb);
  auVar22 = vpternlogd_avx512vl(auVar31,ZEXT416((uint)(fVar27 * 7.5)),auVar26,0xf8);
  auVar22 = ZEXT416((uint)(fVar27 * 7.5 + auVar22._0_4_));
  auVar22 = vroundss_avx(auVar22,auVar22,0xb);
  auVar23 = vpternlogd_avx512vl(auVar31,ZEXT416((uint)(fVar27 * 8.5)),auVar26,0xf8);
  auVar23 = ZEXT416((uint)(fVar27 * 8.5 + auVar23._0_4_));
  auVar23 = vroundss_avx(auVar23,auVar23,0xb);
  auVar24 = vpternlogd_avx512vl(auVar31,ZEXT416((uint)(fVar27 * 9.5)),auVar26,0xf8);
  auVar24 = ZEXT416((uint)(fVar27 * 9.5 + auVar24._0_4_));
  auVar24 = vroundss_avx(auVar24,auVar24,0xb);
  auVar25 = vpternlogd_avx512vl(auVar31,ZEXT416((uint)(fVar27 * 10.5)),auVar26,0xf8);
  auVar25 = ZEXT416((uint)(fVar27 * 10.5 + auVar25._0_4_));
  auVar25 = vroundss_avx(auVar25,auVar25,0xb);
  auVar26 = vpternlogd_avx512vl(auVar31,ZEXT416((uint)(fVar27 * 11.5)),auVar26,0xf8);
  fVar34 = auVar17._0_4_;
  fVar1 = fVar34 + auVar16._0_4_;
  local_b8 = CONCAT44(local_b8._4_4_,fVar34 + auVar15._0_4_);
  fVar2 = fVar34 - auVar18._0_4_;
  auVar17 = ZEXT416((uint)(fVar27 * 11.5 + auVar26._0_4_));
  auVar17 = vroundss_avx(auVar17,auVar17,0xb);
  local_b0 = CONCAT44(local_b0._4_4_,fVar34 - auVar15._0_4_);
  fVar27 = fVar34 - auVar20._0_4_;
  local_a8 = CONCAT44(local_a8._4_4_,fVar34 - auVar16._0_4_);
  fVar3 = fVar34 - auVar19._0_4_;
  fVar35 = auVar22._0_4_;
  fVar34 = fVar34 - auVar21._0_4_;
  local_68._0_4_ = fVar35 - auVar17._0_4_;
  local_a0 = (float *)CONCAT44(local_a0._4_4_,fVar35 - auVar18._0_4_);
  local_98 = CONCAT44(local_98._4_4_,fVar35 - auVar19._0_4_);
  fVar4 = fVar35 - auVar21._0_4_;
  local_90 = (float *)CONCAT44(local_90._4_4_,fVar35 - auVar20._0_4_);
  local_88 = CONCAT44(local_88._4_4_,fVar35 - auVar23._0_4_);
  fVar5 = fVar35 - auVar25._0_4_;
  auVar33 = ZEXT464((uint)fVar5);
  local_80 = CONCAT44(local_80._4_4_,fVar35 - auVar24._0_4_);
  local_70 = ipoint;
  local_50 = iimage;
  gauss_s1_c0[0] = expf(fVar36 * fVar1 * fVar1);
  gauss_s1_c0[1] = expf((float)local_b8 * (float)local_b8 * fVar36);
  gauss_s1_c0[2] = expf((float)local_b0 * (float)local_b0 * fVar36);
  gauss_s1_c0[3] = expf((float)local_a8 * (float)local_a8 * fVar36);
  gauss_s1_c0[4] = 1.0;
  gauss_s1_c0[5] = expf(fVar2 * fVar2 * fVar36);
  gauss_s1_c0[6] = expf(fVar3 * fVar3 * fVar36);
  gauss_s1_c0[7] = expf(fVar27 * fVar27 * fVar36);
  gauss_s1_c0[8] = expf(fVar34 * fVar34 * fVar36);
  gauss_s1_c1[0] = expf(local_a0._0_4_ * local_a0._0_4_ * fVar36);
  gauss_s1_c1[1] = expf((float)local_98 * (float)local_98 * fVar36);
  gauss_s1_c1[2] = expf(local_90._0_4_ * local_90._0_4_ * fVar36);
  gauss_s1_c1[3] = expf(fVar4 * fVar4 * fVar36);
  gauss_s1_c1[4] = 1.0;
  gauss_s1_c1[5] = expf((float)local_88 * (float)local_88 * fVar36);
  gauss_s1_c1[6] = expf((float)local_80 * (float)local_80 * fVar36);
  gauss_s1_c1[7] = expf(fVar5 * fVar5 * fVar36);
  gauss_s1_c1[8] = expf((float)local_68._0_4_ * (float)local_68._0_4_ * fVar36);
  auVar30 = ZEXT1264(ZEXT812(0));
  local_b8 = 0;
  local_d0 = 0;
  uVar10 = 0xfffffff8;
  while (uVar8 = (uint)uVar10, (int)uVar8 < 8) {
    pfVar11 = gauss_s1_c0;
    if (uVar8 == 7) {
      pfVar11 = gauss_s1_c1;
    }
    if (uVar8 == 0xfffffff8) {
      pfVar11 = gauss_s1_c1;
    }
    lVar9 = (long)(int)(float)local_b8;
    local_a0 = (float *)((long)pfVar11 + (ulong)(uint)((int)(uVar10 >> 0x1f) << 5));
    local_d0 = (long)(int)local_d0;
    uVar6 = (int)(float)local_b8 + 4;
    local_b8 = (ulong)uVar6;
    local_b0 = (long)(int)uVar6;
    local_e0 = 9;
    local_c8 = 0xfffffffffffffff8;
    local_58 = uVar10;
    while (lVar9 != local_b0) {
      local_90 = gauss_s1_c0;
      local_f8 = 0.0;
      fStack_f4 = 0.0;
      fStack_f0 = 0.0;
      fStack_ec = 0.0;
      iVar7 = (int)local_c8;
      uVar10 = (ulong)((uint)(local_c8 >> 0x1c) & 8);
      if (iVar7 == 7) {
        local_90 = gauss_s1_c1;
      }
      if (iVar7 == -8) {
        local_90 = gauss_s1_c1;
      }
      local_98 = (ulong)(-1 < iVar7) * 2 + -1;
      uVar6 = iVar7 + 8;
      local_a8 = lVar9;
      while (uVar6 != local_e0) {
        auVar22._0_4_ = (float)(int)(uVar6 - 0xc);
        auVar22._4_12_ = auVar33._4_12_;
        auVar15 = vfmadd132ss_fma(auVar22,ZEXT416((uint)local_78),ZEXT416((uint)local_48._0_4_));
        auVar23._8_4_ = 0x3effffff;
        auVar23._0_8_ = 0x3effffff3effffff;
        auVar23._12_4_ = 0x3effffff;
        auVar21._8_4_ = 0x80000000;
        auVar21._0_8_ = 0x8000000080000000;
        auVar21._12_4_ = 0x80000000;
        auVar16 = vpternlogd_avx512vl(auVar23,auVar15,auVar21,0xf8);
        fVar27 = local_90[uVar10];
        auVar15 = ZEXT416((uint)(auVar15._0_4_ + auVar16._0_4_));
        auVar15 = vroundss_avx(auVar15,auVar15,0xb);
        iVar13 = 9;
        pfVar11 = local_a0;
        iVar12 = uVar8 + 8;
        local_88 = (ulong)uVar6;
        local_80 = uVar10;
        while (bVar14 = iVar13 != 0, iVar13 = iVar13 + -1, bVar14) {
          rx = 0.0;
          ry = 0.0;
          auVar28._0_4_ = (float)(iVar12 + -0xc);
          auVar28._4_12_ = auVar33._4_12_;
          auVar16 = vfmadd132ss_fma(auVar28,ZEXT416((uint)local_74),ZEXT416((uint)local_48._0_4_));
          auVar32._8_4_ = 0x3effffff;
          auVar32._0_8_ = 0x3effffff3effffff;
          auVar32._12_4_ = 0x3effffff;
          auVar24._8_4_ = 0x80000000;
          auVar24._0_8_ = 0x8000000080000000;
          auVar24._12_4_ = 0x80000000;
          auVar17 = vpternlogd_avx512vl(auVar32,auVar16,auVar24,0xf8);
          auVar16 = ZEXT416((uint)(auVar16._0_4_ + auVar17._0_4_));
          auVar16 = vroundss_avx(auVar16,auVar16,0xb);
          local_68 = ZEXT416((uint)(fVar27 * *pfVar11));
          haarXY_precheck_boundaries
                    (local_50,(int)auVar15._0_4_ - scale,(int)auVar16._0_4_ - scale,scale,&rx,&ry);
          iVar12 = iVar12 + 1;
          pfVar11 = pfVar11 + (ulong)(~uVar8 >> 0x1f) * 2 + -1;
          auVar16 = vinsertps_avx(ZEXT416((uint)ry),ZEXT416((uint)rx),0x10);
          auVar29._0_4_ = (float)local_68._0_4_ * auVar16._0_4_;
          auVar29._4_4_ = (float)local_68._0_4_ * auVar16._4_4_;
          auVar29._8_4_ = (float)local_68._0_4_ * auVar16._8_4_;
          auVar29._12_4_ = (float)local_68._0_4_ * auVar16._12_4_;
          auVar25._8_4_ = 0x7fffffff;
          auVar25._0_8_ = 0x7fffffff7fffffff;
          auVar25._12_4_ = 0x7fffffff;
          auVar16 = vandps_avx512vl(auVar29,auVar25);
          auVar16 = vmovlhps_avx(auVar29,auVar16);
          local_f8 = local_f8 + auVar16._0_4_;
          fStack_f4 = fStack_f4 + auVar16._4_4_;
          fStack_f0 = fStack_f0 + auVar16._8_4_;
          fStack_ec = fStack_ec + auVar16._12_4_;
        }
        uVar10 = local_80 + local_98;
        uVar6 = (int)local_88 + 1;
      }
      auVar19._4_4_ = fStack_f4;
      auVar19._0_4_ = local_f8;
      auVar19._8_4_ = fStack_f0;
      auVar19._12_4_ = fStack_ec;
      local_e0 = local_e0 + 5;
      fVar27 = gauss_s2_arr[local_a8];
      auVar15._4_4_ = fVar27;
      auVar15._0_4_ = fVar27;
      auVar15._8_4_ = fVar27;
      auVar15._12_4_ = fVar27;
      auVar17 = vmulps_avx512vl(auVar19,auVar15);
      lVar9 = local_a8 + 1;
      auVar20._0_4_ = auVar17._0_4_ * auVar17._0_4_;
      auVar20._4_4_ = auVar17._4_4_ * auVar17._4_4_;
      auVar20._8_4_ = auVar17._8_4_ * auVar17._8_4_;
      auVar20._12_4_ = auVar17._12_4_ * auVar17._12_4_;
      auVar16 = vshufpd_avx(auVar17,auVar17,1);
      *(undefined1 (*) [16])(local_70->descriptor + local_d0) = auVar17;
      local_d0 = local_d0 + 4;
      auVar15 = vmovshdup_avx(auVar20);
      auVar15 = vfmadd231ss_fma(auVar15,auVar17,auVar17);
      local_c8 = (ulong)(iVar7 + 5);
      auVar16 = vfmadd213ss_fma(auVar16,auVar16,auVar15);
      auVar15 = vshufps_avx(auVar17,auVar17,0xff);
      auVar15 = vfmadd213ss_fma(auVar15,auVar15,auVar16);
      auVar30 = ZEXT464((uint)(auVar30._0_4_ + auVar15._0_4_));
    }
    uVar10 = (ulong)((int)local_58 + 5);
  }
  if (auVar30._0_4_ < 0.0) {
    fVar27 = sqrtf(auVar30._0_4_);
  }
  else {
    auVar15 = vsqrtss_avx(auVar30._0_16_,auVar30._0_16_);
    fVar27 = auVar15._0_4_;
  }
  for (lVar9 = 0; lVar9 != 0x40; lVar9 = lVar9 + 1) {
    local_70->descriptor[lVar9] = (1.0 / fVar27) * local_70->descriptor[lVar9];
  }
  return;
}

Assistant:

void get_msurf_descriptor_precompute_gauss_array(struct integral_image* iimage, struct interest_point* ipoint) {
    /*
    applied optimizations:
        - equal to get_msurf_descriptor_gauss_compute_once_case but with arrays insteat of case statements
    */

    float scale = ipoint->scale;
    // float scale_mul_25f = 2.5f*scale;
    int int_scale = (int) roundf(scale);
    // int int_scale_mul_2 =  2 * int_scale;
    float scale_squared = scale*scale;

    float g1_factor = -0.08f / (scale_squared); // since 0.08f / (scale*scale) == 1.0f / (2.0f * 2.5f * scale * 2.5f * scale)
    //float g2_factor = -1.0f / 4.5f; // since 1.0f / 4.5f == 1.0f / (2.0f * 1.5f * 1.5f)

    float ipoint_x = roundf(ipoint->x) + 0.5*scale;
    float ipoint_y = roundf(ipoint->y) + 0.5*scale;

    // build descriptor
    float* descriptor = ipoint->descriptor;
    int desc_idx = 0;
    float sum_of_squares = 0.0f;

    // Initializing gauss_s2 index for precomputed array
    int gauss_s2_index = 0;

    //r(2.5*s) + r(1.5*s) == -(r(2.5*s) - r(6.5*s))

    float s0  = roundf( 0.5 * scale);
    float s1  = roundf( 1.5 * scale);
    float s2  = roundf( 2.5 * scale);
    float s3  = roundf( 3.5 * scale);
    float s4  = roundf( 4.5 * scale);
    float s5  = roundf( 5.5 * scale);
    float s6  = roundf( 6.5 * scale);
    float s7  = roundf( 7.5 * scale);
    float s8  = roundf( 8.5 * scale);
    float s9  = roundf( 9.5 * scale);
    float s10 = roundf(10.5 * scale);
    float s11 = roundf(11.5 * scale);

    float e_c0_m4 = s2 + s1; // CAREFUL HERE!
    float e_c0_m3 = s2 + s0; // CAREFUL HERE!
    float e_c0_m2 = s2 - s0;
    float e_c0_m1 = s2 - s1;
    //float e_c0_z0 = s2 - s2;
    float e_c0_p1 = s2 - s3;
    float e_c0_p2 = s2 - s4;
    float e_c0_p3 = s2 - s5;
    float e_c0_p4 = s2 - s6;

    float e_c1_m4 = s7 - s3;
    float e_c1_m3 = s7 - s4;
    float e_c1_m2 = s7 - s5;
    float e_c1_m1 = s7 - s6;
    //float e_c1_z0 = s7 - s7;
    float e_c1_p1 = s7 - s8;
    float e_c1_p2 = s7 - s9;
    float e_c1_p3 = s7 - s10;
    float e_c1_p4 = s7 - s11;

    gauss_s1_c0[0] =  expf(g1_factor * (e_c0_m4 * e_c0_m4));
    gauss_s1_c0[1] =  expf(g1_factor * (e_c0_m3 * e_c0_m3));
    gauss_s1_c0[2] =  expf(g1_factor * (e_c0_m2 * e_c0_m2));
    gauss_s1_c0[3] =  expf(g1_factor * (e_c0_m1 * e_c0_m1));
    gauss_s1_c0[4] =  1.0f; //expf(g1_factor * (e_c0_z0 * e_c0_z0));
    gauss_s1_c0[5] =  expf(g1_factor * (e_c0_p1 * e_c0_p1));
    gauss_s1_c0[6] =  expf(g1_factor * (e_c0_p2 * e_c0_p2));
    gauss_s1_c0[7] =  expf(g1_factor * (e_c0_p3 * e_c0_p3));
    gauss_s1_c0[8] =  expf(g1_factor * (e_c0_p4 * e_c0_p4));

    gauss_s1_c1[0] =  expf(g1_factor * (e_c1_m4 * e_c1_m4));
    gauss_s1_c1[1] =  expf(g1_factor * (e_c1_m3 * e_c1_m3));
    gauss_s1_c1[2] =  expf(g1_factor * (e_c1_m2 * e_c1_m2));
    gauss_s1_c1[3] =  expf(g1_factor * (e_c1_m1 * e_c1_m1));
    gauss_s1_c1[4] =  1.0f; //expf(g1_factor * (e_c1_z0 * e_c1_z0));
    gauss_s1_c1[5] =  expf(g1_factor * (e_c1_p1 * e_c1_p1));
    gauss_s1_c1[6] =  expf(g1_factor * (e_c1_p2 * e_c1_p2));
    gauss_s1_c1[7] =  expf(g1_factor * (e_c1_p3 * e_c1_p3));
    gauss_s1_c1[8] =  expf(g1_factor * (e_c1_p4 * e_c1_p4));

    // calculate descriptor for this interest point

    for (int i=-8; i<8; i+=5) {

        float *i_arr;
        if (i == -8 || i == 7) {
            i_arr = gauss_s1_c1;
        } else {
            i_arr = gauss_s1_c0;
        } 

        int gauss_index_k_start = (i<0?8:0);
        int gauss_index_k_inc = (i<0?-1:1);

        for (int j=-8; j<8; j+=5) {

            float *j_arr;
            if (j == -8 || j == 7) {
                j_arr = gauss_s1_c1;
            } else {
                j_arr = gauss_s1_c0;
            } 

            float dx = 0.0f;
            float dy = 0.0f; 
            float mdx = 0.0f; 
            float mdy = 0.0f;

            int gauss_index_l = (j<0?8:0);
            int gauss_index_l_inc = (j<0?-1:1);
            for (int l = (j+8); l < (j + 17); ++l, gauss_index_l+=gauss_index_l_inc) {

                int sample_y = (int) roundf(ipoint_y + (l-12) * scale);
                int sample_y_sub_int_scale = sample_y-int_scale;

                float gauss_s1_y = j_arr[gauss_index_l];

                int gauss_index_k = gauss_index_k_start;
                for (int k = i+8; k < i + 17; ++k, gauss_index_k+=gauss_index_k_inc) {

                    int sample_x = (int) roundf(ipoint_x + (k-12) * scale);
                    int sample_x_sub_int_scale = sample_x-int_scale;
                    
                    float gauss_s1_x = i_arr[gauss_index_k];

                    float gauss_s1 = gauss_s1_x * gauss_s1_y;

                    float rx = 0.0f;
                    float ry = 0.0f;
                    haarXY_precheck_boundaries(iimage, sample_y_sub_int_scale, sample_x_sub_int_scale, int_scale, &rx, &ry);
                    
                    //Get the gaussian weighted x and y responses on rotated axis
                    float rrx = gauss_s1 * ry;
                    float rry = gauss_s1 * rx;

                    dx += rrx;
                    dy += rry;
                    mdx += fabsf(rrx);
                    mdy += fabsf(rry);
                }
            }

            // Precomputed 4x4 gauss_s2 with (x,y) = {-1.5, -0.5, 0.5, 1.5}^2 and sig = 1.5f
            float gauss_s2 = gauss_s2_arr[gauss_s2_index];
            gauss_s2_index++;

            // add the values to the descriptor vector
            float d1 = dx * gauss_s2;
            float d2 = dy * gauss_s2;
            float d3 = mdx * gauss_s2;
            float d4 = mdy * gauss_s2;

            descriptor[desc_idx] = d1;
            descriptor[desc_idx+1] = d2;
            descriptor[desc_idx+2] = d3;
            descriptor[desc_idx+3] = d4;

            // precompute for normaliztion
            sum_of_squares += (d1*d1 + d2*d2 + d3*d3 + d4*d4);

            desc_idx += 4;

        }
    }

    /* Code pre optimization
    for (int i=-8; i<8; i+=5) {

        for (int j=-8; j<8; j+=5) {

            float dx = 0.0f;
            float dy = 0.0f; 
            float mdx = 0.0f; 
            float mdy = 0.0f;

            //int xs = (int) roundf(ipoint_x + (i+0.5f) * scale);
            //int ys = (int) roundf(ipoint_y + (j+0.5f) * scale);

            int gauss_index_l = -4;
            for (int l = j-4; l < j + 5; ++l, ++gauss_index_l) {

                //Get y coords of sample point
                int sample_y = (int) roundf(ipoint_y + l * scale);
                //float ys_sub_sample_y = (float) ys-sample_y;
                //float ys_sub_sample_y_squared = ys_sub_sample_y*ys_sub_sample_y;

                //Get y coords of sample point
                int sample_y_sub_int_scale = sample_y-int_scale;

                float gauss_s1_y = -1;
                if (j == -8 ) {
                    gauss_s1_y = gauss_s1_c1[8-(gauss_index_l+4)];
                } else if (j == -3) {
                    gauss_s1_y = gauss_s1_c0[8-(gauss_index_l+4)];
                } else if (j == 2) {
                    gauss_s1_y = gauss_s1_c0[gauss_index_l+4];
                } else if (j == 7) {
                    gauss_s1_y = gauss_s1_c1[gauss_index_l+4];
                }

                int gauss_index_k = -4;
                for (int k = i-4; k < i + 5; ++k, ++gauss_index_k) {
                
                    //Get x coords of sample point
                    int sample_x = (int) roundf(ipoint_x + k * scale);
                    //float xs_sub_sample_x = (float) xs-sample_x;
                    //float xs_sub_sample_x_squared = xs_sub_sample_x*xs_sub_sample_x;

                    //Get x coords of sample point
                    int sample_x_sub_int_scale = sample_x-int_scale;

                    float gauss_s1_x = -1;
                    if (i == -8 ) {
                        gauss_s1_x = gauss_s1_c1[8-(gauss_index_k+4)];
                    } else if (i == -3) {
                        gauss_s1_x = gauss_s1_c0[8-(gauss_index_k+4)];
                    } else if (i == 2) {
                        gauss_s1_x = gauss_s1_c0[gauss_index_k+4];
                    } else if (i == 7) {
                        gauss_s1_x = gauss_s1_c1[gauss_index_k+4];
                    }

                    float gauss_s1 = gauss_s1_x * gauss_s1_y;

                    float rx = 0.0f;
                    float ry = 0.0f;
                    haarXY_precheck_boundaries(iimage, sample_y_sub_int_scale, sample_x_sub_int_scale, int_scale, &rx, &ry);
                    
                    //Get the gaussian weighted x and y responses on rotated axis
                    float rrx = gauss_s1 * ry;
                    float rry = gauss_s1 * rx;

                    dx += rrx;
                    dy += rry;
                    mdx += fabsf(rrx);
                    mdy += fabsf(rry);
                }
            }

            //float gauss_s2 = expf(g2_factor * (cx_squared + cy_squared)); 
            // Precomputed 4x4 gauss_s2 with (x,y) = {-1.5, -0.5, 0.5, 1.5}^2 and sig = 1.5f
            //float gauss_s2 = gauss_s2_precomputed[gauss_s2_index++];
            float gauss_s2 = gauss_s2_arr[gauss_s2_index];
            gauss_s2_index++;

            // add the values to the descriptor vector
            float d1 = dx * gauss_s2;
            float d2 = dy * gauss_s2;
            float d3 = mdx * gauss_s2;
            float d4 = mdy * gauss_s2;

            descriptor[desc_idx] = d1;
            descriptor[desc_idx+1] = d2;
            descriptor[desc_idx+2] = d3;
            descriptor[desc_idx+3] = d4;

            // precompute for normaliztion
            sum_of_squares += (d1*d1 + d2*d2 + d3*d3 + d4*d4);

            desc_idx += 4;

        }
    }
    */
    // rescale to unit vector
    // NOTE: using sqrtf() for floats
    float norm_factor = 1.0f / sqrtf(sum_of_squares);

    for (int i = 0; i < 64; ++i) {
        descriptor[i] *= norm_factor;
    }
}